

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  RefData<vk::Handle<(vk::HandleType)22>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  allocator<char> local_429;
  string local_428;
  Move<vk::Handle<(vk::HandleType)22>_> local_408;
  RefData<vk::Handle<(vk::HandleType)22>_> local_3e8;
  undefined1 local_3c8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj3;
  RefData<vk::Handle<(vk::HandleType)22>_> local_388;
  undefined1 local_368 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj2;
  RefData<vk::Handle<(vk::HandleType)22>_> local_328;
  undefined1 local_308 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj1;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2c8;
  undefined1 local_2a8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj0;
  Resources res3;
  Resources res2;
  undefined1 local_168 [8];
  Resources res1;
  Resources res0;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = (Environment *)
         &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
          deleter.m_allocator;
  Environment::Environment(this,context,1);
  DescriptorSet::Resources::Resources
            ((Resources *)
             &res1.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,this,params);
  DescriptorSet::Resources::Resources((Resources *)local_168,this,params);
  DescriptorSet::Resources::Resources
            ((Resources *)
             &res3.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Environment *)
             &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,params);
  DescriptorSet::Resources::Resources
            ((Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,(Environment *)
              &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
               .deleter.m_allocator,params);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj1.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (Environment *)
             &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)
             &res1.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2c8,
             (Move *)&obj1.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  data.deleter.m_deviceIface = local_2c8.deleter.m_deviceIface;
  data.object.m_internal = local_2c8.object.m_internal;
  data.deleter.m_device = local_2c8.deleter.m_device;
  data.deleter.m_pool.m_internal = local_2c8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2a8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj1.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (Environment *)
             &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,(Resources *)local_168,params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_328,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface = local_328.deleter.m_deviceIface;
  data_00.object.m_internal = local_328.object.m_internal;
  data_00.deleter.m_device = local_328.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_328.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_308,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (Environment *)
             &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)
             &res3.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_388,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  data_01.deleter.m_deviceIface = local_388.deleter.m_deviceIface;
  data_01.object.m_internal = local_388.object.m_internal;
  data_01.deleter.m_device = local_388.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_388.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_368,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  DescriptorSet::create
            (&local_408,
             (Environment *)
             &res0.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3e8,(Move *)&local_408);
  data_02.deleter.m_deviceIface = local_3e8.deleter.m_deviceIface;
  data_02.object.m_internal = local_3e8.object.m_internal;
  data_02.deleter.m_device = local_3e8.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_3e8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3c8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_408);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_368);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_308);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Ok",&local_429);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  DescriptorSet::Resources::~Resources
            ((Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  DescriptorSet::Resources::~Resources
            ((Resources *)
             &res3.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator);
  DescriptorSet::Resources::~Resources((Resources *)local_168);
  DescriptorSet::Resources::~Resources
            ((Resources *)
             &res1.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}